

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

el_action_t ed_next_char(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wchar_t *lim;
  wint_t c_local;
  EditLine *el_local;
  
  pwVar1 = (el->el_line).lastchar;
  if (((el->el_line).cursor < pwVar1) &&
     ((((el->el_line).cursor != pwVar1 + -1 || ((el->el_map).type != L'\x01')) ||
      ((el->el_chared).c_vcmd.action != L'\0')))) {
    (el->el_line).cursor = (el->el_line).cursor + (el->el_state).argument;
    if (pwVar1 < (el->el_line).cursor) {
      (el->el_line).cursor = pwVar1;
    }
    if (((el->el_map).type == L'\x01') && ((el->el_chared).c_vcmd.action != L'\0')) {
      cv_delfini(el);
      el_local._7_1_ = '\x04';
    }
    else {
      el_local._7_1_ = '\x05';
    }
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_next_char(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *lim = el->el_line.lastchar;

	if (el->el_line.cursor >= lim ||
	    (el->el_line.cursor == lim - 1 &&
	    el->el_map.type == MAP_VI &&
	    el->el_chared.c_vcmd.action == NOP))
		return CC_ERROR;

	el->el_line.cursor += el->el_state.argument;
	if (el->el_line.cursor > lim)
		el->el_line.cursor = lim;

	if (el->el_map.type == MAP_VI)
		if (el->el_chared.c_vcmd.action != NOP) {
			cv_delfini(el);
			return CC_REFRESH;
		}
	return CC_CURSOR;
}